

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_recon.c
# Opt level: O1

REF_STATUS ref_recon_rsn_hess_face(REF_GRID ref_grid,REF_DBL *hessian)

{
  size_t __size;
  int iVar1;
  REF_NODE ref_node;
  REF_GLOB *pRVar2;
  REF_NODE pRVar3;
  REF_ADJ pRVar4;
  REF_ADJ_ITEM pRVar5;
  uint id;
  uint uVar6;
  uint uVar7;
  REF_STATUS RVar8;
  REF_CLOUD *ppRVar9;
  REF_DBL *pRVar10;
  ulong uVar11;
  REF_INT node;
  long lVar12;
  long lVar13;
  REF_CELL pRVar14;
  long lVar15;
  double *pdVar16;
  REF_CLOUD *one_layer;
  long global;
  bool bVar17;
  double __x;
  REF_INT max_id;
  REF_CLOUD ref_cloud;
  REF_BOOL has_support;
  REF_INT min_id;
  REF_INT geom;
  REF_DBL node_hessian [3];
  REF_DBL s [3];
  REF_DBL r [3];
  REF_DBL n [3];
  uint local_138;
  REF_INT local_134;
  uint local_11c;
  ulong local_118;
  int local_10c;
  REF_DBL *local_108;
  REF_CLOUD local_100;
  int local_f4;
  uint local_f0;
  int local_ec;
  double local_e8;
  double dStack_e0;
  double local_d8;
  ulong local_c8;
  REF_CELL local_c0;
  REF_FACELIFT local_b8;
  REF_GEOM local_b0;
  REF_DBL local_a8;
  REF_DBL local_a0;
  REF_DBL local_98;
  double local_90;
  REF_DBL local_88 [4];
  REF_DBL local_68 [4];
  REF_DBL local_48 [3];
  
  ref_node = ref_grid->node;
  pRVar14 = ref_grid->cell[3];
  iVar1 = ref_node->max;
  one_layer = (REF_CLOUD *)(long)iVar1;
  if (0 < (long)one_layer) {
    pRVar2 = ref_node->global;
    ppRVar9 = (REF_CLOUD *)0x0;
    pRVar10 = hessian;
    do {
      if (-1 < pRVar2[(long)ppRVar9]) {
        *pRVar10 = 0.0;
        pRVar10[1] = 0.0;
        pRVar10[2] = 0.0;
      }
      ppRVar9 = (REF_CLOUD *)((long)ppRVar9 + 1);
      pRVar10 = pRVar10 + 3;
    } while (one_layer != ppRVar9);
  }
  if (iVar1 < 0) {
    bVar17 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x6b6,
           "ref_recon_rsn_hess_face");
    local_138 = 1;
  }
  else {
    __size = (long)one_layer * 8;
    one_layer = (REF_CLOUD *)malloc(__size);
    if (one_layer == (REF_CLOUD *)0x0) {
      bVar17 = false;
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x6b6
             ,"ref_recon_rsn_hess_face");
      local_138 = 2;
      one_layer = (REF_CLOUD *)0x0;
    }
    else {
      bVar17 = true;
      if (iVar1 != 0) {
        memset(one_layer,0,__size);
      }
    }
  }
  if (bVar17) {
    local_138 = ref_cell_id_range(pRVar14,ref_grid->mpi,(REF_INT *)&local_f0,&local_10c);
    if (local_138 == 0) {
      id = local_f0;
      if ((int)local_f0 <= local_10c) {
        do {
          local_118 = (ulong)id;
          if (0 < ref_node->max) {
            lVar15 = 0;
            ppRVar9 = one_layer;
            do {
              if ((-1 < ref_node->global[lVar15]) &&
                 (uVar6 = ref_cloud_create(ppRVar9,4), uVar6 != 0)) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                       ,0x6bc,"ref_recon_rsn_hess_face",(ulong)uVar6,"cloud storage");
                return uVar6;
              }
              lVar15 = lVar15 + 1;
              ppRVar9 = ppRVar9 + 1;
            } while (lVar15 < ref_node->max);
          }
          pRVar3 = ref_grid->node;
          uVar11 = 0;
          if (0 < pRVar3->max) {
            pRVar14 = ref_grid->cell[3];
            local_b0 = ref_grid->geom;
            local_b8 = local_b0->ref_facelift;
            lVar15 = 0;
            local_108 = hessian;
            do {
              if ((-1 < pRVar3->global[lVar15]) && (pRVar3->ref_mpi->id == pRVar3->part[lVar15])) {
                pRVar4 = pRVar14->ref_adj;
                uVar11 = 0xffffffff;
                if (lVar15 < pRVar4->nnode) {
                  uVar11 = (ulong)(uint)pRVar4->first[lVar15];
                }
                if ((int)uVar11 != -1) {
                  local_134 = pRVar4->item[(int)uVar11].ref;
                  local_c0 = pRVar14;
                  do {
                    local_c8 = uVar11;
                    if ((0 < pRVar14->node_per) &&
                       (pRVar14->c2n[pRVar14->size_per * local_134 + pRVar14->node_per] == id)) {
                      lVar12 = 0;
                      do {
                        iVar1 = pRVar14->c2n[(long)local_134 * (long)pRVar14->size_per + lVar12];
                        lVar13 = (long)iVar1;
                        global = -1;
                        if (((-1 < lVar13) && (iVar1 < pRVar3->max)) &&
                           (global = pRVar3->global[lVar13], global < 0)) {
                          global = -1;
                        }
                        pRVar10 = pRVar3->real;
                        local_a8 = pRVar10[lVar13 * 0xf];
                        local_a0 = pRVar10[lVar13 * 0xf + 1];
                        local_98 = pRVar10[lVar13 * 0xf + 2];
                        local_11c = ref_geom_find(local_b0,iVar1,2,id,&local_ec);
                        if (local_11c != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                                 ,0x301,"ref_recon_local_immediate_cloud_geom",(ulong)local_11c,
                                 "find geom");
LAB_001f1e29:
                          uVar11 = (ulong)local_11c;
                          hessian = local_108;
                          goto LAB_001f1e3d;
                        }
                        pRVar10 = local_b8->displacement;
                        lVar13 = (long)local_ec;
                        __x = pRVar10[lVar13 * 3 + 2] * pRVar10[lVar13 * 3 + 2] +
                              pRVar10[lVar13 * 3 + 1] * pRVar10[lVar13 * 3 + 1] +
                              pRVar10[lVar13 * 3] * pRVar10[lVar13 * 3];
                        if (__x < 0.0) {
                          local_90 = sqrt(__x);
                        }
                        else {
                          local_90 = SQRT(__x);
                        }
                        local_11c = ref_cloud_store(one_layer[lVar15],global,&local_a8);
                        if (local_11c != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                                 ,0x304,"ref_recon_local_immediate_cloud_geom",(ulong)local_11c,
                                 "store could stencil");
                          goto LAB_001f1e29;
                        }
                        lVar12 = lVar12 + 1;
                        pRVar14 = local_c0;
                      } while ((int)lVar12 < local_c0->node_per);
                    }
                    pRVar5 = pRVar14->ref_adj->item;
                    iVar1 = pRVar5[(int)local_c8].next;
                    uVar11 = (ulong)iVar1;
                    if (uVar11 == 0xffffffffffffffff) {
                      local_134 = -1;
                    }
                    else {
                      local_134 = pRVar5[uVar11].ref;
                    }
                  } while (iVar1 != -1);
                }
              }
              lVar15 = lVar15 + 1;
            } while (lVar15 < pRVar3->max);
            uVar11 = 0;
            hessian = local_108;
          }
LAB_001f1e3d:
          if ((int)uVar11 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                   ,0x6bf,"ref_recon_rsn_hess_face",uVar11,"fill immediate cloud");
            return (int)uVar11;
          }
          uVar6 = ref_recon_ghost_cloud(one_layer,ref_node);
          if (uVar6 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                   ,0x6c0,"ref_recon_rsn_hess_face",(ulong)uVar6,"fill ghosts");
            return uVar6;
          }
          if (0 < ref_node->max) {
            lVar15 = 0;
            do {
              if (-1 < ref_node->global[lVar15]) {
                node = (REF_INT)lVar15;
                uVar6 = ref_geom_id_supported(ref_grid->geom,node,2,id,&local_f4);
                if (uVar6 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                         ,0x6c5,"ref_recon_rsn_hess_face",(ulong)uVar6,"geom support");
                  return uVar6;
                }
                if ((local_f4 != 0) && (ref_node->ref_mpi->id == ref_node->part[lVar15])) {
                  uVar6 = ref_recon_rsn(ref_grid,node,local_68,local_88,local_48);
                  if (uVar6 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                           ,0x6c7,"ref_recon_rsn_hess_face",(ulong)uVar6,"rsn");
                    return uVar6;
                  }
                  uVar6 = ref_cloud_deep_copy(&local_100,one_layer[lVar15]);
                  if (uVar6 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                           ,0x6ca,"ref_recon_rsn_hess_face",(ulong)uVar6,"create ref_cloud");
                    return uVar6;
                  }
                  pdVar16 = (double *)((lVar15 * 0x18 & 0x7fffffff8U) + (long)hessian);
                  uVar6 = 2;
                  do {
                    uVar7 = ref_recon_grow_cloud_one_layer(local_100,one_layer,ref_node);
                    if (uVar7 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                             ,0x6ce,"ref_recon_rsn_hess_face",(ulong)uVar7,"grow");
                      return uVar7;
                    }
                    lVar12 = -1;
                    if ((lVar15 < ref_node->max) && (lVar12 = ref_node->global[lVar15], lVar12 < 0))
                    {
                      lVar12 = -1;
                    }
                    RVar8 = ref_recon_kexact_rs(lVar12,local_100,local_68,local_88,&local_e8);
                    if (4 < uVar6 && RVar8 == 4) {
                      ref_node_location(ref_node,node);
                      printf(" caught %s, for %d layers to kexact cloud; retry\n","REF_DIV_ZERO",
                             (ulong)uVar6);
                    }
                    if (RVar8 == 8 && 4 < uVar6) {
                      ref_node_location(ref_node,node);
                      printf(" caught %s, for %d layers to kexact cloud; retry\n",
                             "REF_ILL_CONDITIONED",(ulong)uVar6);
                    }
                  } while ((RVar8 != 0) && (bVar17 = uVar6 < 8, uVar6 = uVar6 + 1, bVar17));
                  if (RVar8 == 0) {
                    if (hessian[lVar15 * 3 + 2] * hessian[lVar15 * 3 + 2] +
                        hessian[lVar15 * 3] * hessian[lVar15 * 3] +
                        hessian[lVar15 * 3 + 1] * hessian[lVar15 * 3 + 1] <
                        local_d8 * local_d8 + local_e8 * local_e8 + dStack_e0 * dStack_e0) {
                      pdVar16[2] = local_d8;
                      *pdVar16 = local_e8;
                      pdVar16[1] = dStack_e0;
                    }
                  }
                  else {
                    printf("skip contribution to face %d at ",local_118);
                    uVar6 = ref_node_location(ref_node,node);
                    if (uVar6 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                             ,0x6e6,"ref_recon_rsn_hess_face",(ulong)uVar6,"loc");
                      return uVar6;
                    }
                  }
                  uVar6 = ref_cloud_free(local_100);
                  if (uVar6 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                           ,0x6e9,"ref_recon_rsn_hess_face",(ulong)uVar6,"free ref_cloud");
                    return uVar6;
                  }
                }
              }
              lVar15 = lVar15 + 1;
            } while (lVar15 < ref_node->max);
          }
          if (0 < ref_node->max) {
            lVar15 = 0;
            do {
              if (-1 < ref_node->global[lVar15]) {
                ref_cloud_free(one_layer[lVar15]);
              }
              lVar15 = lVar15 + 1;
            } while (lVar15 < ref_node->max);
          }
          bVar17 = (int)id < local_10c;
          id = id + 1;
        } while (bVar17);
      }
      if (one_layer != (REF_CLOUD *)0x0) {
        free(one_layer);
      }
      local_138 = ref_node_ghost_dbl(ref_node,hessian,3);
      if (local_138 == 0) {
        local_138 = ref_recon_abs_value_hessian2(ref_grid,hessian);
        if (local_138 == 0) {
          local_138 = 0;
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
                 0x6f5,"ref_recon_rsn_hess_face",(ulong)local_138,"abs(H)");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
               0x6f3,"ref_recon_rsn_hess_face",(ulong)local_138,"update ghosts");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x6b8
             ,"ref_recon_rsn_hess_face",(ulong)local_138,"face id range");
    }
  }
  return local_138;
}

Assistant:

REF_FCN REF_STATUS ref_recon_rsn_hess_face(REF_GRID ref_grid,
                                           REF_DBL *hessian) {
  REF_CLOUD *one_layer;
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT node, im, min_id, max_id, id;
  REF_CLOUD ref_cloud;
  REF_DBL r[3], s[3], n[3];
  REF_DBL node_hessian[3];
  REF_STATUS status;
  REF_INT layer;
  REF_BOOL has_support;

  each_ref_node_valid_node(ref_node, node) {
    hessian[0 + 3 * node] = 0.0;
    hessian[1 + 3 * node] = 0.0;
    hessian[2 + 3 * node] = 0.0;
  }

  ref_malloc_init(one_layer, ref_node_max(ref_node), REF_CLOUD, NULL);
  RSS(ref_cell_id_range(ref_cell, ref_grid_mpi(ref_grid), &min_id, &max_id),
      "face id range");

  for (id = min_id; id <= max_id; id++) {
    each_ref_node_valid_node(ref_node, node) {
      RSS(ref_cloud_create(&(one_layer[node]), 4), "cloud storage");
    }
    RSS(ref_recon_local_immediate_cloud_geom(one_layer, ref_grid, id),
        "fill immediate cloud");
    RSS(ref_recon_ghost_cloud(one_layer, ref_node), "fill ghosts");

    each_ref_node_valid_node(ref_node, node) {
      RSS(ref_geom_id_supported(ref_grid_geom(ref_grid), node, REF_GEOM_FACE,
                                id, &has_support),
          "geom support");
      if (has_support && ref_node_owned(ref_node, node)) {
        RSS(ref_recon_rsn(ref_grid, node, r, s, n), "rsn");
        /* use ref_cloud to get a unique list of halo(2) nodes */
        RSS(ref_cloud_deep_copy(&ref_cloud, one_layer[node]),
            "create ref_cloud");
        status = REF_INVALID;
        for (layer = 2; status != REF_SUCCESS && layer <= 8; layer++) {
          RSS(ref_recon_grow_cloud_one_layer(ref_cloud, one_layer, ref_node),
              "grow");

          status = ref_recon_kexact_rs(ref_node_global(ref_node, node),
                                       ref_cloud, r, s, node_hessian);
          if (REF_DIV_ZERO == status && layer > 4) {
            ref_node_location(ref_node, node);
            printf(" caught %s, for %d layers to kexact cloud; retry\n",
                   "REF_DIV_ZERO", layer);
          }
          if (REF_ILL_CONDITIONED == status && layer > 4) {
            ref_node_location(ref_node, node);
            printf(" caught %s, for %d layers to kexact cloud; retry\n",
                   "REF_ILL_CONDITIONED", layer);
          }
        }
        if (REF_SUCCESS == status) {
          if (ref_math_dot(&(hessian[3 * node]), &(hessian[3 * node])) <
              ref_math_dot(node_hessian, node_hessian)) {
            for (im = 0; im < 3; im++) {
              hessian[im + 3 * node] = node_hessian[im];
            }
          }
        } else {
          printf("skip contribution to face %d at ", id);
          RSS(ref_node_location(ref_node, node), "loc");
        }

        RSS(ref_cloud_free(ref_cloud), "free ref_cloud");
      }
    }

    each_ref_node_valid_node(ref_node, node) {
      ref_cloud_free(one_layer[node]); /* no-op for null */
    }
  }
  ref_free(one_layer);

  RSS(ref_node_ghost_dbl(ref_node, hessian, 3), "update ghosts");

  RSS(ref_recon_abs_value_hessian2(ref_grid, hessian), "abs(H)");

  return REF_SUCCESS;
}